

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

int compareElementRecursive
              (QCborContainerPrivate *c1,Element *e1,QCborContainerPrivate *c2,Element *e2,
              Comparison mode)

{
  Element e;
  Element e_00;
  QStringView rhs;
  QUtf8StringView lhs;
  QStringView lhs_00;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QUtf8StringView QVar7;
  size_type len2;
  size_type len1;
  ByteData *b2;
  ByteData *b1;
  int cmp;
  Comparison in_stack_fffffffffffffe3c;
  undefined4 in_stack_fffffffffffffe40;
  Type in_stack_fffffffffffffe44;
  ByteData *in_stack_fffffffffffffe48;
  storage_type *in_stack_fffffffffffffe60;
  QCborContainerPrivate *in_stack_fffffffffffffe68;
  Element *in_stack_fffffffffffffe70;
  Comparison in_stack_fffffffffffffe78;
  undefined4 uVar8;
  Comparison in_stack_fffffffffffffe7c;
  undefined4 uVar9;
  anon_union_8_2_4ee71171_for_Element_0 in_stack_fffffffffffffe80;
  QCborContainerPrivate *in_stack_fffffffffffffe88;
  Comparison in_stack_fffffffffffffe90;
  byte local_161;
  qsizetype in_stack_fffffffffffffea8;
  storage_type_conflict *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  storage_type_conflict *psVar10;
  storage_type_conflict *psVar11;
  storage_type_conflict *local_130;
  ByteData *local_128;
  ByteData *local_120;
  bool local_fd;
  uint local_50;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_4c;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_48;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_44;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_40;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_18;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_14;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_10;
  QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = typeOrder((Type)in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
  if (local_50 == 0) {
    local_c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorage<QtCbor::Element::ValueFlag>)
         QFlags<QtCbor::Element::ValueFlag>::operator&
                   ((QFlags<QtCbor::Element::ValueFlag> *)
                    CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                    in_stack_fffffffffffffe3c);
    bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_c);
    local_fd = true;
    if (!bVar1) {
      local_10.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)
           QFlags<QtCbor::Element::ValueFlag>::operator&
                     ((QFlags<QtCbor::Element::ValueFlag> *)
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe3c);
      local_fd = QFlags::operator_cast_to_bool((QFlags *)&local_10);
    }
    if (local_fd == false) {
      if (in_RDI == 0) {
        local_120 = (ByteData *)0x0;
      }
      else {
        local_28 = *in_RSI;
        local_20 = in_RSI[1];
        e._8_8_ = in_stack_fffffffffffffe88;
        e.field_0.value = in_stack_fffffffffffffe80.value;
        local_120 = QCborContainerPrivate::byteData(in_stack_fffffffffffffe68,e);
      }
      if (in_RDX == 0) {
        local_128 = (ByteData *)0x0;
      }
      else {
        local_38 = *in_RCX;
        local_30 = in_RCX[1];
        e_00._8_8_ = in_stack_fffffffffffffe88;
        e_00.field_0.value = in_stack_fffffffffffffe80.value;
        local_128 = QCborContainerPrivate::byteData(in_stack_fffffffffffffe68,e_00);
      }
      if ((local_120 == (ByteData *)0x0) && (local_128 == (ByteData *)0x0)) {
        local_50 = compareElementNoData
                             (in_stack_fffffffffffffe70,(Element *)in_stack_fffffffffffffe68);
      }
      else {
        if (local_120 == (ByteData *)0x0) {
          local_130 = (storage_type_conflict *)0x0;
        }
        else {
          local_130 = (storage_type_conflict *)local_120->len;
        }
        if (local_128 == (ByteData *)0x0) {
          psVar10 = (storage_type_conflict *)0x0;
        }
        else {
          psVar10 = (storage_type_conflict *)local_128->len;
        }
        if ((local_130 == (storage_type_conflict *)0x0) || (psVar10 == (storage_type_conflict *)0x0)
           ) {
          if ((long)local_130 < (long)psVar10) {
            local_50 = 0xffffffff;
          }
          else {
            local_50 = (uint)(local_130 != psVar10);
          }
        }
        else {
          psVar11 = psVar10;
          local_3c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
               (QFlagsStorage<QtCbor::Element::ValueFlag>)
               QFlags<QtCbor::Element::ValueFlag>::operator&
                         ((QFlags<QtCbor::Element::ValueFlag> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3c);
          bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_3c);
          in_stack_fffffffffffffec0 = in_stack_fffffffffffffec0 & 0xffffff;
          if (bVar1) {
            local_40.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
                 (QFlagsStorage<QtCbor::Element::ValueFlag>)
                 QFlags<QtCbor::Element::ValueFlag>::operator&
                           ((QFlags<QtCbor::Element::ValueFlag> *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe3c);
            bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_40);
            in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
          }
          if ((char)(in_stack_fffffffffffffec0 >> 0x18) == '\0') {
            local_44.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
                 (QFlagsStorage<QtCbor::Element::ValueFlag>)
                 QFlags<QtCbor::Element::ValueFlag>::operator&
                           ((QFlags<QtCbor::Element::ValueFlag> *)
                            CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                            in_stack_fffffffffffffe3c);
            bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_44);
            local_161 = 0;
            if (!bVar1) {
              local_48.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
                   (QFlagsStorage<QtCbor::Element::ValueFlag>)
                   QFlags<QtCbor::Element::ValueFlag>::operator&
                             ((QFlags<QtCbor::Element::ValueFlag> *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe3c);
              bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_48);
              local_161 = bVar1 ^ 0xff;
            }
            if ((local_161 & 1) == 0) {
              local_4c.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
                   (QFlagsStorage<QtCbor::Element::ValueFlag>)
                   QFlags<QtCbor::Element::ValueFlag>::operator&
                             ((QFlags<QtCbor::Element::ValueFlag> *)
                              CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                              in_stack_fffffffffffffe3c);
              bVar1 = QFlags::operator_cast_to_bool((QFlags *)&local_4c);
              if (bVar1) {
                QVar6 = QtCbor::ByteData::asStringView(in_stack_fffffffffffffe48);
                uVar8 = QVar6.m_data._0_4_;
                uVar9 = QVar6.m_data._4_4_;
                QVar7 = QtCbor::ByteData::asUtf8StringView(in_stack_fffffffffffffe48);
                QVar5.m_data._0_4_ = uVar8;
                QVar5.m_size = (qsizetype)QVar7.m_data;
                QVar5.m_data._4_4_ = uVar9;
                QVar7.m_size = QVar7.m_size;
                QVar7.m_data = in_stack_fffffffffffffe60;
                local_50 = compareStringsInUtf8(QVar5,QVar7,in_stack_fffffffffffffe3c);
              }
              else {
                QtCbor::ByteData::asUtf8StringView(in_stack_fffffffffffffe48);
                QtCbor::ByteData::asStringView(in_stack_fffffffffffffe48);
                lhs.m_size._0_4_ = in_stack_fffffffffffffec0;
                lhs.m_data = (storage_type *)in_stack_fffffffffffffeb8;
                lhs.m_size._4_4_ = in_stack_fffffffffffffec4;
                rhs.m_data = in_stack_fffffffffffffeb0;
                rhs.m_size = in_stack_fffffffffffffea8;
                local_50 = compareStringsInUtf8(lhs,rhs,in_stack_fffffffffffffe90);
              }
            }
            else if (local_130 == psVar10) {
              if (in_R8D == 0) {
                pcVar3 = QtCbor::ByteData::byte(local_120);
                pcVar4 = QtCbor::ByteData::byte(local_128);
                iVar2 = memcmp(pcVar3,pcVar4,(size_t)local_130);
                local_50 = (uint)(iVar2 != 0);
              }
              else {
                pcVar3 = QtCbor::ByteData::byte(local_120);
                pcVar4 = QtCbor::ByteData::byte(local_128);
                local_50 = memcmp(pcVar3,pcVar4,(size_t)local_130);
              }
            }
            else {
              local_50 = 1;
              if ((long)local_130 < (long)psVar10) {
                local_50 = 0xffffffff;
              }
            }
          }
          else {
            QVar5 = QtCbor::ByteData::asStringView(in_stack_fffffffffffffe48);
            QtCbor::ByteData::asStringView(in_stack_fffffffffffffe48);
            lhs_00.m_size._4_4_ = in_stack_fffffffffffffec4;
            lhs_00.m_size._0_4_ = in_stack_fffffffffffffec0;
            lhs_00.m_data = psVar11;
            QVar6.m_data = (storage_type_conflict *)QVar5.m_size;
            QVar6.m_size = (qsizetype)QVar5.m_data;
            local_50 = compareStringsInUtf8(lhs_00,QVar6,in_stack_fffffffffffffe78);
          }
        }
      }
    }
    else {
      local_14.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)
           QFlags<QtCbor::Element::ValueFlag>::operator&
                     ((QFlags<QtCbor::Element::ValueFlag> *)
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe3c);
      QFlags::operator_cast_to_bool((QFlags *)&local_14);
      local_18.super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (QFlagsStorage<QtCbor::Element::ValueFlag>)
           QFlags<QtCbor::Element::ValueFlag>::operator&
                     ((QFlags<QtCbor::Element::ValueFlag> *)
                      CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                      in_stack_fffffffffffffe3c);
      QFlags::operator_cast_to_bool((QFlags *)&local_18);
      local_50 = compareContainer(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80.container,
                                  in_stack_fffffffffffffe7c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_50;
  }
  __stack_chk_fail();
}

Assistant:

static int compareElementRecursive(const QCborContainerPrivate *c1, const Element &e1,
                                   const QCborContainerPrivate *c2, const Element &e2,
                                   Comparison mode) noexcept
{
    int cmp = typeOrder(e1.type, e2.type);
    if (cmp != 0)
        return cmp;

    if ((e1.flags & Element::IsContainer) || (e2.flags & Element::IsContainer))
        return compareContainer(e1.flags & Element::IsContainer ? e1.container : nullptr,
                                e2.flags & Element::IsContainer ? e2.container : nullptr, mode);

    // string data?
    const ByteData *b1 = c1 ? c1->byteData(e1) : nullptr;
    const ByteData *b2 = c2 ? c2->byteData(e2) : nullptr;
    if (b1 || b2) {
        auto len1 = b1 ? b1->len : 0;
        auto len2 = b2 ? b2->len : 0;
        if (len1 == 0 || len2 == 0)
            return len1 < len2 ? -1 : len1 == len2 ? 0 : 1;

        // we definitely have data from this point forward
        Q_ASSERT(b1);
        Q_ASSERT(b2);

        // Officially with CBOR, we sort first the string with the shortest
        // UTF-8 length. Since US-ASCII is just a subset of UTF-8, its length
        // is the UTF-8 length. But the UTF-16 length may not be directly
        // comparable.
        if ((e1.flags & Element::StringIsUtf16) && (e2.flags & Element::StringIsUtf16))
            return compareStringsInUtf8(b1->asStringView(), b2->asStringView(), mode);

        if (!(e1.flags & Element::StringIsUtf16) && !(e2.flags & Element::StringIsUtf16)) {
            // Neither is UTF-16, so lengths are comparable too
            // (this case includes byte arrays too)
            if (len1 == len2) {
                if (mode == Comparison::ForEquality) {
                    // GCC optimizes this to __memcmpeq(); Clang to bcmp()
                    return memcmp(b1->byte(), b2->byte(), size_t(len1)) == 0 ? 0 : 1;
                }
                return memcmp(b1->byte(), b2->byte(), size_t(len1));
            }
            return len1 < len2 ? -1 : 1;
        }

        // Only one is UTF-16
        if (e1.flags & Element::StringIsUtf16)
            return compareStringsInUtf8(b1->asStringView(), b2->asUtf8StringView(), mode);
        else
            return compareStringsInUtf8(b1->asUtf8StringView(), b2->asStringView(), mode);
    }

    return compareElementNoData(e1, e2);
}